

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufferGrow(xmlBufferPtr buf,uint len)

{
  int iVar1;
  xmlChar *local_28;
  xmlChar *newbuf;
  uint size;
  uint len_local;
  xmlBufferPtr buf_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    buf_local._4_4_ = -1;
  }
  else if (len < buf->size - buf->use) {
    buf_local._4_4_ = 0;
  }
  else if (len < 0x7fffffff - buf->use) {
    if (len < buf->size) {
      if (buf->size < 0x40000000) {
        newbuf._0_4_ = buf->size << 1;
      }
      else {
        newbuf._0_4_ = 0x7fffffff;
      }
    }
    else {
      iVar1 = buf->use + len;
      newbuf._0_4_ = iVar1 + 1;
      if ((uint)newbuf < 0x7fffff9c) {
        newbuf._0_4_ = iVar1 + 0x65;
      }
    }
    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->content != buf->contentIO)) {
      local_28 = (xmlChar *)(*xmlMalloc)((size_t)(uint)newbuf);
      if (local_28 == (xmlChar *)0x0) {
        return -1;
      }
      if (buf->content != (xmlChar *)0x0) {
        memcpy(local_28,buf->content,(ulong)(buf->use + 1));
      }
      (*xmlFree)(buf->contentIO);
    }
    else {
      local_28 = (xmlChar *)(*xmlRealloc)(buf->content,(size_t)(uint)newbuf);
      if (local_28 == (xmlChar *)0x0) {
        return -1;
      }
    }
    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
      buf->contentIO = local_28;
    }
    buf->content = local_28;
    buf->size = (uint)newbuf;
    buf_local._4_4_ = (buf->size - buf->use) + -1;
  }
  else {
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufferGrow(xmlBufferPtr buf, unsigned int len) {
    unsigned int size;
    xmlChar *newbuf;

    if (buf == NULL)
        return(-1);

    if (len < buf->size - buf->use)
        return(0);
    if (len >= INT_MAX - buf->use)
        return(-1);

    if (buf->size > (size_t) len) {
        if (buf->size <= INT_MAX / 2)
            size = buf->size * 2;
        else
            size = INT_MAX;
    } else {
        size = buf->use + len + 1;
        if (size <= INT_MAX - 100)
            size += 100;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->content != buf->contentIO)) {
        newbuf = xmlMalloc(size);
        if (newbuf == NULL)
            return(-1);
        if (buf->content != NULL)
            memcpy(newbuf, buf->content, buf->use + 1);
        xmlFree(buf->contentIO);
    } else {
        newbuf = xmlRealloc(buf->content, size);
        if (newbuf == NULL)
            return(-1);
    }

    if (buf->alloc == XML_BUFFER_ALLOC_IO)
        buf->contentIO = newbuf;
    buf->content = newbuf;
    buf->size = size;

    return(buf->size - buf->use - 1);
}